

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O2

int __thiscall NNTreeIterator::remove(NNTreeIterator *this,char *__filename)

{
  QPDFObjectHandle *key;
  list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_> *this_00;
  string *key_00;
  QPDF *qpdf;
  NNTreeIterator *pNVar1;
  int iVar2;
  int iVar3;
  int extraout_EAX;
  string *key_01;
  logic_error *plVar4;
  int iVar5;
  iterator iVar6;
  _List_node_base *p_Var7;
  allocator<char> local_c1;
  NNTreeIterator *local_c0;
  string local_b8;
  QPDFObjectHandle kids;
  iterator result;
  QPDFObjectHandle items;
  QPDFObjectHandle local_70;
  QPDFObjectHandle local_60;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  if (this->item_number < 0) {
    plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar4,"attempt made to remove an invalid iterator");
    __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  key = &this->node;
  (*(code *)**(undefined8 **)this->impl->details)();
  QPDFObjectHandle::getKey(&items,(string *)key);
  iVar2 = QPDFObjectHandle::getArrayNItems(&items);
  if (this->item_number + 2 <= iVar2) {
    QPDFObjectHandle::eraseItem(&items,this->item_number);
    QPDFObjectHandle::eraseItem(&items,this->item_number);
    if (iVar2 < 3) {
      this_00 = &this->path;
      if ((this->path).
          super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
          ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)this_00) {
        setItemNumber(this,&this->impl->oh,-1);
      }
      else {
        local_c0 = this;
        while( true ) {
          p_Var7 = (_List_node_base *)this_00;
          if ((local_c0->path).
              super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
              ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)this_00) {
            p_Var7 = (local_c0->path).
                     super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                     ._M_impl._M_node.super__List_node_base._M_prev;
          }
          iVar6._M_node = p_Var7->_M_prev;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"/Kids",&local_c1);
          key_00 = (string *)(p_Var7 + 1);
          QPDFObjectHandle::getKey(&kids,key_00);
          std::__cxx11::string::~string((string *)&local_b8);
          QPDFObjectHandle::eraseItem(&kids,*(int *)&p_Var7[2]._M_next);
          iVar2 = QPDFObjectHandle::getArrayNItems(&kids);
          if (0 < iVar2) {
            iVar5 = *(int *)&p_Var7[2]._M_next;
            if (iVar5 == 0 || iVar5 == iVar2) {
              std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_50,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key_00);
              resetLimits(local_c0,(QPDFObjectHandle *)&local_50,iVar6);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_50._M_refcount);
              iVar5 = *(int *)&p_Var7[2]._M_next;
            }
            if (iVar5 == iVar2) {
              local_b8._M_dataplus._M_p = (pointer)0x0;
              local_b8._M_string_length = 0;
              setItemNumber(local_c0,(QPDFObjectHandle *)&local_b8,-1);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8._M_string_length);
              *(int *)&p_Var7[2]._M_next = *(int *)&p_Var7[2]._M_next + -1;
              QPDFObjectHandle::getArrayItem(&local_60,(int)&kids);
              pNVar1 = local_c0;
              deepen(local_c0,&local_60,false,true);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_60.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
              if (-1 < pNVar1->item_number) {
                increment(pNVar1,false);
              }
            }
            else {
              QPDFObjectHandle::getArrayItem(&local_70,(int)&kids);
              deepen(local_c0,&local_70,true,true);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_70.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            }
            goto LAB_0012710a;
          }
          if (iVar6._M_node == (_List_node_base *)this_00) break;
          std::__cxx11::
          list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::pop_back
                    (this_00);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&kids.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        }
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"/Kids",&local_c1);
        QPDFObjectHandle::removeKey((QPDFObjectHandle *)key_00,&local_b8);
        pNVar1 = local_c0;
        std::__cxx11::string::~string((string *)&local_b8);
        key_01 = (string *)(*(code *)**(undefined8 **)pNVar1->impl->details)();
        QPDFObjectHandle::newArray();
        QPDFObjectHandle::replaceKey
                  ((QPDFObjectHandle *)key_00,key_01,(QPDFObjectHandle *)&local_b8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8._M_string_length);
        std::__cxx11::
        list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::clear
                  (this_00);
        setItemNumber(pNVar1,&pNVar1->impl->oh,-1);
LAB_0012710a:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&kids.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
    }
    else {
      iVar5 = iVar2 + -2;
      iVar3 = this->item_number;
      if (iVar3 == iVar5 || iVar3 == 0) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_40,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key);
        iVar6._M_node = (_List_node_base *)&this->path;
        if ((this->path).
            super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
            ._M_impl._M_node.super__List_node_base._M_next != iVar6._M_node) {
          iVar6._M_node =
               (this->path).
               super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
        }
        resetLimits(this,(QPDFObjectHandle *)&local_40,iVar6);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
        iVar3 = this->item_number;
      }
      if (iVar3 == iVar5) {
        this->item_number = iVar2 + -4;
        increment(this,false);
      }
      else {
        if (iVar5 <= iVar3) goto LAB_0012718f;
        updateIValue(this,true);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&items.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return extraout_EAX;
  }
  qpdf = this->impl->qpdf;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"found short items array while removing an item",
             (allocator<char> *)&kids);
  ::error(qpdf,key,&local_b8);
LAB_0012718f:
  plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar4,"NNTreeIterator::remove: item_number > nitems after erase");
  __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

bool
NNTreeIterator::valid() const
{
    return this->item_number >= 0;
}